

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreply.cpp
# Opt level: O1

void __thiscall QNetworkReplyPrivate::QNetworkReplyPrivate(QNetworkReplyPrivate *this)

{
  long in_FS_OFFSET;
  Attribute copy;
  Attribute local_3c;
  QVariant local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QIODevicePrivate::QIODevicePrivate(&this->super_QIODevicePrivate,QObjectPrivateVersion);
  *(undefined8 *)((long)&(this->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.ptr + 1)
       = 0;
  *(undefined8 *)((long)&(this->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.size + 1)
       = 0;
  (this->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.d = (Data *)0x0;
  (this->super_QNetworkHeadersPrivate).rawHeaderCache.headersList.d.ptr =
       (pair<QByteArray,_QByteArray> *)0x0;
  QHttpHeaders::QHttpHeaders(&(this->super_QNetworkHeadersPrivate).httpHeaders);
  (this->super_QNetworkHeadersPrivate).originatingObject.wp.d = (Data *)0x0;
  (this->super_QNetworkHeadersPrivate).originatingObject.wp.value = (QObject *)0x0;
  (this->super_QNetworkHeadersPrivate).cookedHeaders.d = (Data *)0x0;
  (this->super_QNetworkHeadersPrivate).attributes.d = (Data *)0x0;
  *(undefined ***)this = &PTR__QNetworkReplyPrivate_002d03a0;
  QNetworkRequest::QNetworkRequest(&this->request);
  QNetworkRequest::QNetworkRequest(&this->originalRequest);
  QUrl::QUrl(&this->url);
  this->readBufferMaxSize = 0;
  (this->manager).wp.d = (Data *)0x0;
  (this->manager).wp.value = (QObject *)0x0;
  (this->downloadProgressSignalChoke).t1 = -0x8000000000000000;
  (this->downloadProgressSignalChoke).t2 = -0x8000000000000000;
  (this->uploadProgressSignalChoke).t1 = -0x8000000000000000;
  (this->uploadProgressSignalChoke).t2 = -0x8000000000000000;
  this->emitAllUploadProgressSignals = false;
  this->operation = UnknownOperation;
  this->errorCode = NoError;
  this->isFinished = false;
  QVariant::QVariant(&local_38,false);
  local_3c = ConnectionEncryptedAttribute;
  QHash<QNetworkRequest::Attribute,QVariant>::emplace<QVariant_const&>
            ((QHash<QNetworkRequest::Attribute,QVariant> *)
             &(this->super_QNetworkHeadersPrivate).attributes,&local_3c,&local_38);
  QVariant::~QVariant(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyPrivate::QNetworkReplyPrivate()
    : readBufferMaxSize(0),
      emitAllUploadProgressSignals(false),
      operation(QNetworkAccessManager::UnknownOperation),
      errorCode(QNetworkReply::NoError)
    , isFinished(false)
{
    // set the default attribute values
    attributes.insert(QNetworkRequest::ConnectionEncryptedAttribute, false);
}